

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_v4_serial.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint32_t *puVar1;
  uint uVar2;
  void *pvVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var4
  ;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  col_coo;
  int iVar5;
  FILE *__stream;
  ostream *poVar6;
  pointer pdVar7;
  char *pcVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  pointer pdVar18;
  ulong uVar19;
  int iVar20;
  pointer in_R10;
  uint uVar21;
  pointer pdVar22;
  uint uVar23;
  long lVar24;
  pointer pdVar25;
  char *unaff_R14;
  uint uVar26;
  pointer pdVar27;
  int *piVar28;
  int nnz;
  int N;
  MM_typecode matcode;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cscRow;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cscColumn;
  int M;
  vector<unsigned_int,_std::allocator<unsigned_int>_> k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> temp1;
  vector<int,_std::allocator<int>_> result_vector;
  vector<unsigned_int,_std::allocator<unsigned_int>_> l;
  vector<int,_std::allocator<int>_> ones;
  uint local_198;
  uint local_194;
  void *local_190;
  long local_188;
  char local_17c;
  char local_17b;
  char local_17a;
  vector<double,_std::allocator<double>_> local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_158;
  allocator_type local_139;
  pointer local_138;
  pointer local_130;
  pointer local_128;
  pointer pdStack_120;
  pointer local_118;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_108;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Stack_100;
  pointer local_f8;
  undefined1 local_ec [8];
  undefined4 uStack_e4;
  long local_e0;
  long local_d8;
  pointer local_d0;
  vector<int,_std::allocator<int>_> local_c8;
  void *local_b0;
  void *local_a8;
  long local_a0;
  vector<int,_std::allocator<int>_> local_98;
  long local_80;
  pointer local_78;
  void *local_70;
  void *local_68;
  long local_60;
  vector<int,_std::allocator<int>_> local_58;
  long local_40;
  pointer local_38;
  
  local_f8 = (pointer)0x0;
  local_108._M_current = (uint *)0x0;
  _Stack_100._M_current = (uint *)0x0;
  local_118 = (pointer)0x0;
  local_128 = (pointer)0x0;
  pdStack_120 = (pointer)0x0;
  if (argc < 2) goto LAB_00102fb6;
  __stream = fopen(argv[1],"r");
  if (__stream == (FILE *)0x0) goto LAB_00102ff5;
  iVar5 = mm_read_banner((FILE *)__stream,(MM_typecode *)&local_17c);
  if (iVar5 == 0) {
    if (((local_17a == 'C') && (local_17c == 'M')) && (local_17b == 'C')) {
      printf("Sorry, this application does not support ");
      pcVar8 = mm_typecode_to_str(&local_17c);
      printf("Market Market type: [%s]\n",pcVar8);
    }
    else {
      iVar5 = mm_read_mtx_crd_size
                        ((FILE *)__stream,(int *)local_ec,(int *)&local_194,(int *)&local_198);
      if (iVar5 == 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_178,
                   (long)(int)local_198,(allocator_type *)&local_158);
        pdVar12 = local_f8;
        _Var4._M_current = local_108._M_current;
        local_108._M_current =
             (uint *)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        _Stack_100._M_current =
             (uint *)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        local_f8 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((pointer)_Var4._M_current != (pointer)0x0) {
          operator_delete(_Var4._M_current,(long)pdVar12 - (long)_Var4._M_current);
        }
        if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_178,
                   (long)(int)local_198,(allocator_type *)&local_158);
        pdVar11 = local_118;
        pdVar12 = local_128;
        local_128 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        pdStack_120 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish;
        local_118 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pdVar12 != (pointer)0x0) {
          operator_delete(pdVar12,(long)pdVar11 - (long)pdVar12);
        }
        if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_178,(long)(int)local_198,(allocator_type *)&local_158);
        local_130 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_138 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_178,
                   (long)(int)local_198 * 2,(allocator_type *)&local_158);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_158,(long)(int)local_194 + 1,(allocator_type *)&local_b0);
        if (local_17a == 'P') {
          if (local_198 != 0) {
            unaff_R14 = "%d %d\n";
            lVar24 = 0;
            uVar14 = 0;
            do {
              __isoc99_fscanf(__stream,"%d %d\n",(long)local_108._M_current + lVar24,
                              (long)local_128 + lVar24);
              *(undefined8 *)((long)local_130 + lVar24 * 2) = 0x3ff0000000000000;
              *(int *)((long)local_108._M_current + lVar24) =
                   *(int *)((long)local_108._M_current + lVar24) + -1;
              *(int *)((long)local_128 + lVar24) = *(int *)((long)local_128 + lVar24) + -1;
              uVar14 = uVar14 + 1;
              lVar24 = lVar24 + 4;
            } while (uVar14 < local_198);
          }
        }
        else if (local_198 != 0) {
          unaff_R14 = "%d %d %lg\n";
          lVar24 = 0;
          uVar14 = 0;
          pdVar12 = local_130;
          do {
            __isoc99_fscanf(__stream,"%d %d %lg\n",(long)local_108._M_current + lVar24,
                            (long)local_128 + lVar24,pdVar12);
            *(int *)((long)local_108._M_current + lVar24) =
                 *(int *)((long)local_108._M_current + lVar24) + -1;
            *(int *)((long)local_128 + lVar24) = *(int *)((long)local_128 + lVar24) + -1;
            uVar14 = uVar14 + 1;
            lVar24 = lVar24 + 4;
            pdVar12 = pdVar12 + 1;
          } while (uVar14 < local_198);
        }
        if (__stream != _stdin) {
          fclose(__stream);
        }
        pdVar12 = (pointer)local_ec;
        if (local_ec._0_4_ != local_194) {
          printf("COO matrix\' columns and rows are not the same");
        }
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_b0,local_108,
                   _Stack_100,(allocator_type *)&local_c8);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_108,
                   _Stack_100._M_current,local_128,pdStack_120);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_128,pdStack_120,
                   local_b0,local_a8);
        if (local_a8 != local_b0) {
          local_a8 = local_b0;
        }
        pdVar11 = (pointer)&local_194;
        _Var4._M_current = (uint *)local_128;
        col_coo._M_current = local_108._M_current;
        if (*local_108._M_current < *(uint *)local_128) {
          pdVar11 = pdVar12;
          _Var4._M_current = local_108._M_current;
          col_coo._M_current = (uint *)local_128;
        }
        coo2csc((uint32_t *)
                local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,
                local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,_Var4._M_current,col_coo._M_current,local_198 * 2,
                *(uint32_t *)pdVar11,0);
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int *)0x0;
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (int *)0x0;
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 1;
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_58,(long)(int)local_194,(value_type_conflict2 *)&local_98,
                   (allocator_type *)(local_ec + 4));
        local_ec._4_4_ = 0;
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_98,(long)(int)local_194,(value_type_conflict2 *)(local_ec + 4),
                   (allocator_type *)&local_70);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_ec + 4),
                   (long)(int)local_198 * 2,(allocator_type *)&local_70);
        local_190 = (void *)CONCAT44(uStack_e4,local_ec._4_4_);
        local_80 = local_e0;
        local_188 = local_d8;
        local_40 = std::chrono::_V2::system_clock::now();
        if (local_194 != 0) {
          local_78 = (pointer)(local_80 - (long)local_190 >> 2);
          uVar23 = 0;
          do {
            uVar26 = uVar23 + 1;
            pdVar7 = (pointer)(ulong)uVar26;
            pdVar10 = (pointer)((long)local_158.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_158.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2);
            pdVar18 = (pointer)unaff_R14;
            pdVar22 = pdVar7;
            if (pdVar10 <= pdVar7) goto LAB_00102f07;
            local_38 = (pointer)(ulong)uVar23;
            local_d0 = (pointer)(long)(int)uVar26;
            unaff_R14 = (char *)(long)(int)uVar23;
            uVar23 = 0;
            pdVar12 = local_38;
            while( true ) {
              pdVar18 = (pointer)unaff_R14;
              pdVar22 = pdVar12;
              if (pdVar10 <= pdVar12) goto LAB_00102f07;
              if (local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)pdVar7] -
                  local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)pdVar12] <= uVar23) break;
              uVar14 = (ulong)(local_158.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[(long)pdVar12] + uVar23);
              pdVar18 = pdVar11;
              if ((ulong)((long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar14)
              goto LAB_00102f5f;
              pdVar22 = (pointer)(long)(int)*(uint32_t *)
                                             ((long)local_178.
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                             uVar14 * 4);
              pdVar18 = (pointer)((long)pdVar22 + 1);
              pdVar11 = (pointer)unaff_R14;
              if (pdVar10 <= (pointer)((long)pdVar22 + 1)) goto LAB_00102f73;
              pdVar18 = pdVar22;
              if (pdVar10 <= pdVar22) goto LAB_00102f73;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_ec + 4),
                         (ulong)(local_158.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[(long)pdVar22 + 1] -
                                local_158.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[(long)pdVar22]),
                         (allocator_type *)&local_70);
              pdVar11 = (pointer)((long)local_158.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_158.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2);
              pdVar18 = local_d0;
              if (pdVar11 <= local_d0) goto LAB_00102f51;
              pdVar18 = (pointer)unaff_R14;
              if (pdVar11 <= unaff_R14) goto LAB_00102f51;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,
                         (ulong)(local_158.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[(long)local_d0] -
                                local_158.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[(long)unaff_R14]),
                         &local_139);
              pdVar27 = local_38;
              lVar24 = CONCAT44(uStack_e4,local_ec._4_4_);
              pdVar10 = (pointer)(local_e0 - lVar24 >> 2);
              if (local_e0 != lVar24) {
                pdVar11 = pdVar22;
                if ((pointer)((long)local_158.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_158.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2) <= pdVar22)
                goto LAB_00102ef3;
                in_R10 = (pointer)0x0;
                do {
                  pdVar11 = (pointer)(ulong)(local_158.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start
                                             [(long)pdVar22] + (int)in_R10);
                  if ((pointer)((long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 2) <= pdVar11)
                  goto LAB_00102ef3;
                  *(uint32_t *)(lVar24 + (long)in_R10 * 4) =
                       *(uint32_t *)
                        ((long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start + (long)pdVar11 * 4);
                  in_R10 = (pointer)((long)in_R10 + 1);
                } while ((pointer)((long)pdVar10 + (ulong)(pdVar10 == (pointer)0x0)) != in_R10);
              }
              lVar16 = (long)local_68 - (long)local_70 >> 2;
              if (local_68 != local_70) {
                pdVar12 = pdVar7;
                pdVar11 = (pointer)unaff_R14;
                if ((pointer)((long)local_158.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_158.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2) <= unaff_R14)
                goto LAB_00102ef3;
                lVar15 = 0;
                do {
                  pdVar11 = (pointer)(ulong)(local_158.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start
                                             [(long)unaff_R14] + (int)lVar15);
                  in_R10 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if ((pointer)((long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 2) <= pdVar11)
                  goto LAB_00102ef3;
                  uVar21 = *(uint32_t *)
                            ((long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start + (long)pdVar11 * 4);
                  pdVar22 = (pointer)(ulong)uVar21;
                  *(uint *)((long)local_70 + lVar15 * 4) = uVar21;
                  lVar15 = lVar15 + 1;
                } while (lVar16 + (ulong)(lVar16 == 0) != lVar15);
              }
              if (local_e0 == lVar24) {
                uVar14 = 0;
              }
              else {
                in_R10 = (pointer)0x0;
                uVar14 = 0;
                iVar5 = 0;
                iVar20 = 0;
                do {
                  if (lVar16 == iVar5) break;
                  uVar21 = *(uint *)((long)local_70 + (long)iVar5 * 4);
                  uVar2 = *(uint *)(lVar24 + (long)in_R10 * 4);
                  if (uVar2 == uVar21) {
                    uVar14 = (ulong)((int)uVar14 + 1);
                    iVar20 = iVar20 + 1;
LAB_00102b02:
                    iVar5 = iVar5 + 1;
                  }
                  else {
                    if (uVar21 < uVar2) goto LAB_00102b02;
                    iVar20 = iVar20 + 1;
                  }
                  in_R10 = (pointer)(long)iVar20;
                } while (pdVar10 != in_R10);
              }
              if ((int)uVar14 != 0) {
                pdVar12 = (pointer)((long)local_158.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_158.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 2);
                pdVar11 = local_38;
                if ((pdVar12 <= local_38) ||
                   (pdVar11 = (pointer)(ulong)(local_158.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start
                                               [(long)local_38] + uVar23), pdVar12 = local_78,
                   local_78 <= pdVar11)) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,pdVar11,pdVar12);
                  goto LAB_00102fa8;
                }
                *(int *)((long)local_190 + (long)pdVar11 * 4) = (int)uVar14;
              }
              if (local_70 != (void *)0x0) {
                operator_delete(local_70,local_60 - (long)local_70);
              }
              pvVar3 = (void *)CONCAT44(uStack_e4,local_ec._4_4_);
              if (pvVar3 != (void *)0x0) {
                operator_delete(pvVar3,local_d8 - (long)pvVar3);
              }
              uVar23 = uVar23 + 1;
              pdVar10 = (pointer)((long)local_158.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_158.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2);
              pdVar12 = pdVar27;
              pdVar11 = pdVar22;
              pdVar22 = pdVar7;
              if (pdVar10 <= pdVar7) goto LAB_00102f07;
            }
            uVar23 = uVar26;
          } while (uVar26 < local_194);
        }
        if (local_194 != 0) {
          uVar13 = (long)local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          pdVar10 = (pointer)(local_80 - (long)local_190 >> 2);
          uVar23 = 0;
          do {
            uVar26 = uVar23 + 1;
            uVar17 = (ulong)uVar26;
            uVar14 = uVar17;
            if ((uVar13 <= uVar17) || (uVar19 = (ulong)uVar23, uVar14 = uVar19, uVar13 <= uVar19))
            goto LAB_00102fa8;
            local_d0 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pdVar7 = (pointer)((long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 2);
            in_R10 = (pointer)((long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 2);
            pdVar18 = (pointer)CONCAT44(local_98.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                                        local_98.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start._0_4_);
            pdVar12 = (pointer)((long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_finish - (long)pdVar18 >> 2);
            pdVar27 = (pointer)(long)(int)uVar23;
            uVar23 = 0;
            while( true ) {
              uVar21 = local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar17] -
                       local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar19];
              pdVar11 = (pointer)(ulong)uVar21;
              if (uVar21 <= uVar23) break;
              pdVar9 = (pointer)(ulong)(local_158.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar19] + uVar23);
              pdVar22 = pdVar11;
              if (pdVar7 <= pdVar9) goto LAB_00102f3a;
              pdVar22 = pdVar9;
              pdVar25 = pdVar10;
              if (((pdVar10 <= pdVar9) || (pdVar22 = pdVar27, pdVar25 = in_R10, in_R10 <= pdVar27))
                 || (pdVar11 = (pointer)(long)(int)*(uint32_t *)
                                                    ((long)local_178.
                                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  (long)pdVar9 * 4), pdVar22 = pdVar11,
                    pdVar25 = pdVar12, pdVar12 <= pdVar11)) {
                do {
                  pdVar7 = (pointer)std::__throw_out_of_range_fmt
                                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                               ,pdVar22,pdVar25);
                  pdVar9 = pdVar22;
                  pdVar22 = pdVar11;
LAB_00102f3a:
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,pdVar9,pdVar7);
                  unaff_R14 = (char *)pdVar18;
LAB_00102f51:
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,pdVar18);
                  pdVar18 = pdVar22;
LAB_00102f5f:
                  std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
                  pdVar11 = (pointer)unaff_R14;
LAB_00102f73:
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,pdVar18);
                  pdVar18 = pdVar11;
LAB_00102ef3:
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,pdVar11);
                  pdVar22 = pdVar12;
LAB_00102f07:
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,pdVar22);
                  pdVar25 = in_R10;
                } while( true );
              }
              puVar1 = (uint32_t *)((long)pdVar18 + (long)pdVar11 * 4);
              *puVar1 = *puVar1 + *(int *)((long)local_190 + (long)pdVar9 * 4) *
                                  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[(long)pdVar27];
              uVar23 = uVar23 + 1;
              uVar14 = uVar17;
              if (uVar13 <= uVar17) goto LAB_00102fa8;
            }
            uVar23 = uVar26;
          } while (uVar26 < local_194);
        }
        piVar28 = (int *)CONCAT44(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_);
        if (piVar28 !=
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          do {
            local_ec._4_4_ = *piVar28 / 2;
            if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_c8,
                         (iterator)
                         local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)(local_ec + 4));
            }
            else {
              *local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_ec._4_4_;
              local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
            }
            piVar28 = piVar28 + 1;
          } while (piVar28 !=
                   local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        lVar24 = std::chrono::_V2::system_clock::now();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Took ",5);
        poVar6 = std::ostream::_M_insert<double>((double)(lVar24 - local_40) / 1000000000.0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
        std::ostream::put(-0x38);
        std::ostream::flush();
        pvVar3 = (void *)CONCAT44(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,(long)local_98.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar3);
        }
        if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_b0 != (void *)0x0) {
          operator_delete(local_b0,local_a0 - (long)local_b0);
        }
        if (local_190 != (void *)0x0) {
          operator_delete(local_190,local_188 - (long)local_190);
        }
        if (local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (uint32_t *)0x0) {
          operator_delete(local_158.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_158.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_158.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_178.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_130 != (pointer)0x0) {
          operator_delete(local_130,(long)local_138 - (long)local_130);
        }
        if (local_128 != (pointer)0x0) {
          operator_delete(local_128,(long)local_118 - (long)local_128);
        }
        if ((pointer)local_108._M_current != (pointer)0x0) {
          operator_delete(local_108._M_current,(long)local_f8 - (long)local_108._M_current);
        }
        return 0;
      }
    }
    goto LAB_00102ff5;
  }
  goto LAB_00102fbe;
LAB_00102fa8:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14);
LAB_00102fb6:
  main_cold_1();
LAB_00102fbe:
  puts("Could not process Matrix Market banner.");
LAB_00102ff5:
  exit(1);
}

Assistant:

int main(int argc, char** argv){
    int ret_code;
    MM_typecode matcode;
    FILE *f;
    int M, N, nnz;
    uint32_t i;
    std::vector<uint32_t> I, J;
    std::vector<double> val;

    if (argc < 2)
    {
        fprintf(stderr, "Usage: %s [martix-market-filename] [0 for binary or 1 for non binary]\n", argv[0]);
        exit(1);
    }
    else
    {
        if ((f = fopen(argv[1], "r")) == nullptr)
            exit(1);
    }

    if (mm_read_banner(f, &matcode) != 0)
    {
        printf("Could not process Matrix Market banner.\n");
        exit(1);
    }


    /*  This is how one can screen matrix types if their application */
    /*  only supports a subset of the Matrix Market data types.      */

    if (mm_is_complex(matcode) && mm_is_matrix(matcode) &&
        mm_is_sparse(matcode) )
    {
        printf("Sorry, this application does not support ");
        printf("Market Market type: [%s]\n", mm_typecode_to_str(matcode));
        exit(1);
    }

    /* find out size of sparse matrix .... */

    if ((ret_code = mm_read_mtx_crd_size(f, &M, &N, &nnz)) != 0)
        exit(1);


    I = std::vector<uint32_t>(nnz);
    J = std::vector<uint32_t>(nnz);
    val = std::vector<double>(nnz);

    std::vector<uint32_t> cscRow = std::vector<uint32_t>(2*nnz);
    std::vector<uint32_t> cscColumn = std::vector<uint32_t>(N+1);
    std::vector<uint32_t> c_values = std::vector<uint32_t>(0);

    /* NOTE: when reading in doubles, ANSI C requires the use of the "l"  */
    /*   specifier as in "%lg", "%lf", "%le", otherwise errors will occur */
    /*  (ANSI C X3.159-1989, Sec. 4.9.6.2, p. 136 lines 13-15)            */

    /* Replace missing val column with 1s and change the fscanf to match pattern matrices*/

    if (!mm_is_pattern(matcode)) {
        for (i = 0; i < nnz; i++) {
            fscanf(f, "%d %d %lg\n", &I[i], &J[i], &val[i]);
            I[i]--;  /* adjust from 1-based to 0-based */
            J[i]--;
        }
    } else {
        for (i = 0; i < nnz; i++) {
            fscanf(f, "%d %d\n", &I[i], &J[i]);
            val[i] = 1;
            I[i]--;  /* adjust from 1-based to 0-based */
            J[i]--;
        }
    }

    if (f !=stdin) fclose(f);

    if(M != N) {
        printf("COO matrix' columns and rows are not the same");
    }

    // create symmetric values
    std::vector<uint32_t> temp1 = std::vector<uint32_t>(I.begin(), I.end());
    I.insert(std::end(I), std::begin(J), std::end(J));
    J.insert(std::end(J), std::begin(temp1), std::end(temp1));
    temp1.clear();

    if (I[0] < J[0]) {
        coo2csc(&cscRow[0], &cscColumn[0], &I[0], &J[0], 2 * nnz, M, 0);
    } else {
        coo2csc(&cscRow[0], &cscColumn[0], &J[0], &I[0], 2 * nnz, N, 0);
    }

    std::vector<int>c3 = std::vector<int>(0);
    std::vector<int>ones = std::vector<int>(N, 1);
    std::vector<int>result_vector = std::vector<int>(N, 0);
    c_values = std::vector<uint32_t>(2*nnz);

    auto start = std::chrono::high_resolution_clock::now();

    for(i = 0; i < N; i++) {
        for(int j = 0; j < cscColumn.at(i+1) - cscColumn.at(i); j++) {
            int a_row = cscRow.at(cscColumn.at(i) + j);
            int a_col = i;

            std::vector<uint32_t> k = std::vector<uint32_t>(cscColumn.at(a_row+1) - cscColumn.at(a_row));
            std::vector<uint32_t> l = std::vector<uint32_t>(cscColumn.at(a_col+1) - cscColumn.at(a_col));

            int s;
            for(s = 0; s < k.size(); ++s) {
                k[s] = cscRow.at(cscColumn.at(a_row) + s);
            }
            for(s = 0; s < l.size(); ++s) {
                l[s] = cscRow.at(cscColumn.at(a_col) + s);
            }

            int m = 0;
            int n = 0;
            int mul_value = 0;

            while(m != k.size() && n != l.size()) {
                if(k[m] == l[n]) {
                    ++mul_value;
                    ++m;
                    ++n;
                } else if(k[m] > l[n]) {
                    ++n;
                } else{
                    ++m;
                }
            }

            if(mul_value) {
                c_values.at(cscColumn.at(i) + j) = mul_value;
            }
        }
    }

    for(i = 0; i < N; i++) {
        for(int j = 0; j < cscColumn.at(i+1) - cscColumn.at(i); j++) {
            int row = cscRow.at(cscColumn.at(i) + j);
            int col = i;
            int value = c_values.at(cscColumn.at(i) + j);
            result_vector.at(row) += value * ones.at(col);
        }
    }

    for(int res: result_vector){
        c3.push_back(res/2);
    }

    auto stop = std::chrono::high_resolution_clock::now();

    std::chrono::duration<double> elapsed = stop - start;
    std::cout<<"Took "<< elapsed.count() <<std::endl;

//    for(int item: c3){
//        std::cout<< item << " ";
//    }
    std::cout<<std::endl;

    return 0;
}